

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

int refs2id(refs_t *r,SAM_hdr *h)

{
  khint_t kVar1;
  uint uVar2;
  kh_refs_t *pkVar3;
  char *__s2;
  khint32_t *pkVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  ref_entry **pprVar8;
  byte bVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  
  if (r->ref_id != (ref_entry **)0x0) {
    free(r->ref_id);
  }
  if (r->last != (ref_entry *)0x0) {
    r->last = (ref_entry *)0x0;
  }
  iVar13 = h->nref;
  pprVar8 = (ref_entry **)calloc((long)iVar13,8);
  r->ref_id = pprVar8;
  if (pprVar8 == (ref_entry **)0x0) {
    iVar13 = -1;
  }
  else {
    r->nref = iVar13;
    if (0 < iVar13) {
      lVar11 = 0;
      do {
        pkVar3 = r->h_meta;
        __s2 = h->ref[lVar11].name;
        kVar1 = pkVar3->n_buckets;
        uVar14 = 0;
        if (kVar1 == 0) {
LAB_00128a41:
          if (uVar14 == kVar1) goto LAB_00128a80;
          r->ref_id[lVar11] = pkVar3->vals[uVar14];
        }
        else {
          uVar15 = (uint)*__s2;
          if (*__s2 == '\0') {
            uVar15 = 0;
          }
          else {
            cVar5 = __s2[1];
            if (cVar5 != '\0') {
              pcVar10 = __s2 + 2;
              do {
                uVar15 = (int)cVar5 + uVar15 * 0x1f;
                cVar5 = *pcVar10;
                pcVar10 = pcVar10 + 1;
              } while (cVar5 != '\0');
            }
          }
          uVar15 = uVar15 & kVar1 - 1;
          pkVar4 = pkVar3->flags;
          iVar12 = 1;
          uVar14 = uVar15;
          do {
            uVar2 = pkVar4[uVar14 >> 4];
            bVar9 = (char)uVar14 * '\x02' & 0x1e;
            uVar6 = uVar2 >> bVar9;
            if (((uVar6 & 2) != 0) ||
               (((uVar6 & 1) == 0 && (iVar7 = strcmp(pkVar3->keys[uVar14],__s2), iVar7 == 0)))) {
              if ((uVar2 >> bVar9 & 3) != 0) {
                uVar14 = kVar1;
              }
              goto LAB_00128a41;
            }
            uVar14 = uVar14 + iVar12 & kVar1 - 1;
            iVar12 = iVar12 + 1;
          } while (uVar14 != uVar15);
LAB_00128a80:
          fprintf(_stderr,"Unable to find ref name \'%s\'\n",__s2);
          iVar13 = h->nref;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar13);
    }
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int refs2id(refs_t *r, SAM_hdr *h) {
    int i;

    if (r->ref_id)
	free(r->ref_id);
    if (r->last)
	r->last = NULL;

    r->ref_id = calloc(h->nref, sizeof(*r->ref_id));
    if (!r->ref_id)
	return -1;

    r->nref = h->nref;
    for (i = 0; i < h->nref; i++) {
	khint_t k = kh_get(refs, r->h_meta, h->ref[i].name);
	if (k != kh_end(r->h_meta)) {
	    r->ref_id[i] = kh_val(r->h_meta, k);
	} else {
	    fprintf(stderr, "Unable to find ref name '%s'\n",
		    h->ref[i].name);
	}
    }

    return 0;
}